

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> uVar2;
  _Alloc_hider _Var3;
  Result RVar4;
  _Any_data *errors_00;
  Errors errors;
  OptionParser parser;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  OptionParser local_b0;
  
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  _Var3._M_p = local_b0.program_name_._M_dataplus._M_p;
  uVar2 = s_stdout_stream;
  local_b0.program_name_._M_dataplus._M_p = (pointer)0x0;
  s_stdout_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       _Var3._M_p;
  if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
      uVar2._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
    (**(code **)(*(long *)uVar2._M_t.
                          super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                          .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))();
    if ((long *)local_b0.program_name_._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b0.program_name_._M_dataplus._M_p + 8))();
    }
  }
  wabt::OptionParser::OptionParser
            (&local_b0,"wasm-interp",
             "  read a file in the wasm binary format, and run in it a stack-based\n  interpreter.\n\nexamples:\n  # parse binary file test.wasm, and type-check it\n  $ wasm-interp test.wasm\n\n  # parse test.wasm and run all its exported functions\n  $ wasm-interp test.wasm --run-all-exports\n\n  # parse test.wasm, run the exported functions and trace the output\n  $ wasm-interp test.wasm --run-all-exports --trace\n\n  # parse test.wasm and run all its exported functions, setting the\n  # value stack size to 100 elements\n  $ wasm-interp test.wasm -V 100 --run-all-exports\n"
            );
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:73:72)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:73:72)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,'v',"verbose","Use multiple times for more info",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  wabt::Features::AddOptions(&s_features,&local_b0);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:80:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:80:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,'V',"value-stack-size","SIZE","Size in elements of the value stack",
             (Callback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:86:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:86:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,'C',"call-stack-size","SIZE","Size in elements of the call stack",
             (Callback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:91:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:91:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption(&local_b0,'t',"trace","Trace execution",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:95:7)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:95:7)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,"run-all-exports",
             "Run all the exported functions, in order. Useful for testing",
             (NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:99:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:99:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,"host-print",
             "Include an importable function named \"host.print\" for printing to stdout",
             (NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:104:7)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:104:7)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,"dummy-import-func",
             "Provide a dummy implementation of all imported functions. The function will log the call and return an appropriate zero value."
             ,(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_e8 = (code *)0x656d616e656c6966;
  local_f8._8_8_ = 8;
  local_e0 = (code *)((ulong)local_e0 & 0xffffffffffffff00);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:107:22)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:107:22)>
             ::_M_manager;
  local_f8._M_unused._M_object = &local_e8;
  wabt::OptionParser::AddArgument(&local_b0,(string *)&local_f8,One,(Callback *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
    operator_delete(local_f8._M_unused._M_object);
  }
  wabt::OptionParser::Parse(&local_b0,argc,argv);
  if (local_b0.on_error_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b0.on_error_.super__Function_base._M_manager)
              ((_Any_data *)&local_b0.on_error_,(_Any_data *)&local_b0.on_error_,__destroy_functor);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            (&local_b0.arguments_);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            (&local_b0.options_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.description_._M_dataplus._M_p != &local_b0.description_.field_2) {
    operator_delete(local_b0.description_._M_dataplus._M_p);
  }
  paVar1 = &local_b0.program_name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.program_name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.program_name_._M_dataplus._M_p);
  }
  errors_00 = &local_f8;
  local_e8 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_c8 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = (Store *)0x0;
  RVar4 = ReadAndInstantiateModule(s_infile,(Errors *)errors_00,(Ptr *)&local_d8);
  if ((RVar4.enum_ == Ok) && (s_run_all_exports == '\x01')) {
    RunAllExports((Ptr *)&local_d8,(Errors *)errors_00);
  }
  local_b0.program_name_._M_string_length = 0;
  local_b0.program_name_.field_2._M_local_buf[0] = '\0';
  local_b0.program_name_._M_dataplus._M_p = (pointer)paVar1;
  wabt::FormatErrorsToFile
            ((Errors *)&local_f8,Binary,(LexerSourceLineFinder *)0x0,_stderr,&local_b0.program_name_
             ,Never,0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.program_name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.program_name_._M_dataplus._M_p);
  }
  if (local_d8._M_unused._M_object != (void *)0x0) {
    wabt::interp::Store::DeleteRoot((Store *)local_d8._8_8_,(Index)local_c8);
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&local_f8);
  return (int)(RVar4.enum_ != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();

  ParseOptions(argc, argv);

  wabt::Result result = ReadAndRunModule(s_infile);
  return result != wabt::Result::Ok;
}